

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  undefined4 *puVar1;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  code *pcVar3;
  bool bVar4;
  uint in_EAX;
  Recycler *pRVar5;
  Recycler *pRVar6;
  CollectionState CVar7;
  undefined8 *in_FS_OFFSET;
  undefined8 uStack_28;
  
  pRVar6 = this->m_recycler;
  uStack_28._0_4_ = in_EAX;
  if (pRVar6->isHeapEnumInProgress == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1b,"(!m_recycler.isHeapEnumInProgress)",
                       "!m_recycler.isHeapEnumInProgress");
    if (!bVar4) goto LAB_00274a4d;
    *puVar1 = 0;
    pRVar6 = this->m_recycler;
  }
  if (pRVar6->allowAllocationDuringHeapEnum == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f1c,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar4) {
LAB_00274a4d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
    pRVar6 = this->m_recycler;
  }
  EnsureNotCollecting(pRVar6);
  DoCommonSetup(this);
  CVar7 = CollectionStateNotCollecting;
  Recycler::ResetMarks(this->m_recycler,ResetMarkFlags_HeapEnumeration);
  pRVar6 = this->m_recycler;
  uStack_28 = (ulong)(uint)uStack_28;
  pOVar2 = (pRVar6->collectionState).observer;
  pRVar5 = pRVar6;
  if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     (CVar7 = CollectionStateNotCollecting,
     (pRVar6->collectionState).value != CollectionStateNotCollecting)) {
    (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,(long)&uStack_28 + 4,&pRVar6->collectionState);
    pRVar5 = this->m_recycler;
    CVar7 = uStack_28._4_4_;
  }
  (pRVar6->collectionState).value = CVar7;
  pRVar5->isHeapEnumInProgress = true;
  pRVar5->isCollectionDisabled = true;
  return;
}

Assistant:

void Recycler::AutoSetupRecyclerForNonCollectingMark::SetupForHeapEnumeration()
{
    Assert(!m_recycler.isHeapEnumInProgress);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
    m_recycler.EnsureNotCollecting();
    DoCommonSetup();
    m_recycler.ResetMarks(ResetMarkFlags_HeapEnumeration);
    m_recycler.SetCollectionState(CollectionStateNotCollecting);
    m_recycler.isHeapEnumInProgress = true;
    m_recycler.isCollectionDisabled = true;
}